

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

bool __thiscall
AmpIO::GetWriteData(AmpIO *this,quadlet_t *buf,uint offset,uint numQuads,bool doSwap)

{
  uint uVar1;
  ostream *poVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar1 = (*(this->super_FpgaIO).super_BoardIO._vptr_BoardIO[3])();
  if (uVar1 >> 2 < numQuads + offset) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"AmpIO:GetWriteData: invalid args: ",0x22);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  else if (numQuads != 0) {
    uVar3 = 0;
    do {
      if (doSwap) {
        uVar4 = this->WriteBuffer[offset + uVar3];
        uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      }
      else {
        uVar4 = this->WriteBuffer[offset + uVar3];
      }
      buf[uVar3] = uVar4;
      uVar3 = uVar3 + 1;
    } while (numQuads != uVar3);
  }
  return numQuads + offset <= uVar1 >> 2;
}

Assistant:

bool AmpIO::GetWriteData(quadlet_t *buf, unsigned int offset, unsigned int numQuads, bool doSwap) const
{
    unsigned int WriteBufSize = GetWriteNumBytes() / sizeof(quadlet_t);
    if ((offset+numQuads) > WriteBufSize) {
        std::cerr << "AmpIO:GetWriteData: invalid args: " << offset << ", " << numQuads << std::endl;
        return false;
    }

    for (size_t i = 0; i < numQuads; i++)
        buf[i] = doSwap ? bswap_32(WriteBuffer[offset+i]) : WriteBuffer[offset+i];
    return true;
}